

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cpp
# Opt level: O0

int32_t __thiscall DeviceTy::initOnce(DeviceTy *this)

{
  DeviceTy **in_RDI;
  once_flag *unaff_retaddr;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int32_t iVar1;
  
  std::call_once<void(DeviceTy::*)(),DeviceTy*>
            (unaff_retaddr,
             (offset_in_DeviceTy_to_subr *)
             CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI);
  if ((*(byte *)((long)in_RDI + 0x14) & 1) == 0) {
    iVar1 = -1;
  }
  else {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int32_t DeviceTy::initOnce() {
  std::call_once(InitFlag, &DeviceTy::init, this);

  // At this point, if IsInit is true, then either this thread or some other
  // thread in the past successfully initialized the device, so we can return
  // OFFLOAD_SUCCESS. If this thread executed init() via call_once() and it
  // failed, return OFFLOAD_FAIL. If call_once did not invoke init(), it means
  // that some other thread already attempted to execute init() and if IsInit
  // is still false, return OFFLOAD_FAIL.
  if (IsInit)
    return OFFLOAD_SUCCESS;
  else
    return OFFLOAD_FAIL;
}